

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_geometric_normal_predictor_base.h
# Opt level: O3

VectorD<long,_3> * __thiscall
draco::
MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::GetPositionForCorner
          (VectorD<long,_3> *__return_storage_ptr__,
          MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
          *this,CornerIndex ci)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer piVar2;
  ulong uVar3;
  
  if (ci.value_ == 0xffffffff) {
    uVar3 = 0xffffffff;
  }
  else {
    uVar3 = (ulong)(((this->mesh_data_).corner_table_)->corner_to_vertex_map_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[ci.value_].value_;
  }
  pvVar1 = (this->mesh_data_).vertex_to_data_map_;
  piVar2 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (uVar3 < (ulong)((long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar2 >> 2)) {
    GetPositionForDataId(__return_storage_ptr__,this,piVar2[uVar3]);
    return __return_storage_ptr__;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3);
}

Assistant:

VectorD<int64_t, 3> GetPositionForCorner(CornerIndex ci) const {
    DRACO_DCHECK(this->IsInitialized());
    const auto corner_table = mesh_data_.corner_table();
    const auto vert_id = corner_table->Vertex(ci).value();
    const auto data_id = mesh_data_.vertex_to_data_map()->at(vert_id);
    return GetPositionForDataId(data_id);
  }